

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_ttf_font_info *
rf_parse_ttf_font(rf_ttf_font_info *__return_storage_ptr__,void *ttf_data,rf_int font_size)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  stbtt__buf cff;
  rf_ttf_font_info *prVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  stbtt_uint32 sVar9;
  stbtt_uint32 sVar10;
  long lVar11;
  ushort uVar12;
  ulong uVar13;
  char *tag;
  char *tag_00;
  char *tag_01;
  char *tag_02;
  char *tag_03;
  char *tag_04;
  char *tag_05;
  char *tag_06;
  undefined8 extraout_RDX;
  uint uVar14;
  ulong uVar15;
  uchar *puVar16;
  char *pcVar17;
  uint uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined8 uVar21;
  uint uVar22;
  long in_FS_OFFSET;
  bool bVar23;
  stbtt__buf sVar24;
  stbtt__buf fontdict;
  anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect aVar25;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  uchar *local_120;
  uchar *puVar26;
  undefined8 local_f8;
  uchar *local_f0;
  uchar *local_e8;
  stbtt_uint32 local_d0;
  stbtt_uint32 local_cc;
  undefined8 local_c8;
  uchar *local_c0;
  undefined8 local_b8;
  rf_ttf_font_info *local_b0;
  ulong local_a8;
  char *local_a0;
  uchar *local_98;
  stbtt__buf local_90;
  float local_7c;
  stbtt_uint32 local_78;
  stbtt_uint32 local_74;
  stbtt_uint32 local_70;
  stbtt_uint32 local_6c;
  stbtt_uint32 local_68;
  stbtt_uint32 local_64;
  rf_int local_60;
  char *local_58;
  char *pcStack_50;
  undefined8 local_48;
  stbtt__buf local_40;
  
  memset(__return_storage_ptr__,0,200);
  if (font_size < 1 || ttf_data == (void *)0x0) {
    return __return_storage_ptr__;
  }
  local_b8 = 0;
  local_b0 = __return_storage_ptr__;
  local_60 = font_size;
  sVar5 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17db0e,tag);
  uVar13 = (ulong)sVar5;
  sVar6 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edc2,tag_00);
  sVar7 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edc7,tag_01);
  sVar8 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edcc,tag_02);
  sVar9 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edd1,tag_03);
  sVar10 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edd6,tag_04);
  local_74 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17eddb,tag_05);
  local_78 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17ede0,tag_06);
  prVar4 = local_b0;
  bVar23 = true;
  local_a8 = uVar13;
  local_70 = sVar10;
  local_6c = sVar8;
  if ((sVar10 == 0 || sVar9 == 0) || (sVar7 == 0 || sVar5 == 0)) {
    iVar20 = 0;
    uVar14 = 0;
    local_f0 = (uchar *)0x0;
    local_f8 = 0;
    fontdict = (stbtt__buf)ZEXT816(0);
    sVar24 = (stbtt__buf)ZEXT816(0);
    aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             ZEXT816(0);
    local_e8 = (uchar *)0x0;
    local_120 = (uchar *)0x0;
    uVar22 = 0;
    puVar16 = (uchar *)0x0;
    pcVar17 = (char *)0x0;
    goto LAB_0013450f;
  }
  if (sVar8 == 0) {
    local_64 = 2;
    local_68 = 0;
    local_cc = 0;
    uVar13 = 0;
    local_d0 = 0;
    sVar5 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17ede5,
                              (char *)CONCAT71((int7)((ulong)extraout_RDX >> 8),
                                               (sVar10 == 0 || sVar9 == 0) ||
                                               (sVar7 == 0 || sVar5 == 0)));
    if (sVar5 == 0) {
      local_f0 = (uchar *)0x0;
      local_f8 = 0;
      fontdict.cursor = 0;
      fontdict.size = 0;
      fontdict.data = (uchar *)uVar13;
      sVar24 = (stbtt__buf)ZEXT416(0);
    }
    else {
      local_f0 = (uchar *)((ulong)sVar5 + (long)ttf_data);
      local_f8 = 0x2000000000000000;
      local_90.size = 0x20000000;
      local_90.cursor = (uint)local_f0[2];
      if (0x20000000 < local_f0[2]) {
        local_90.cursor = local_90.size;
      }
      local_90.size = 0x20000000;
      local_90.data = local_f0;
      stbtt__cff_get_index(&local_90);
      sVar24 = stbtt__cff_get_index(&local_90);
      local_40 = stbtt__cff_index_get(sVar24,0);
      stbtt__cff_get_index(&local_90);
      fontdict = stbtt__cff_get_index(&local_90);
      stbtt__dict_get_ints(&local_40,0x11,1,&local_68);
      stbtt__dict_get_ints(&local_40,0x106,1,&local_64);
      stbtt__dict_get_ints(&local_40,0x124,1,&local_cc);
      stbtt__dict_get_ints(&local_40,0x125,1,&local_d0);
      cff.data._4_4_ = in_stack_fffffffffffffed4;
      cff.data._0_4_ = in_stack_fffffffffffffed0;
      cff.cursor = (int)in_stack_fffffffffffffed8;
      cff.size = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      sVar24 = stbtt__get_subrs(cff,fontdict);
      sVar8 = local_68;
      sVar5 = local_d0;
      if (local_68 != 0 && local_64 == 2) {
        if (local_cc == 0) {
          aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
                   ZEXT816(0);
          local_e8 = (uchar *)0x0;
          local_120 = (uchar *)0x0;
        }
        else {
          uVar13 = (ulong)local_d0;
          if (uVar13 == 0) goto LAB_001344e8;
          local_90.cursor = local_cc;
          if (local_90.size < (int)local_cc) {
            local_90.cursor = local_90.size;
          }
          if ((int)local_cc < 0) {
            local_90.cursor = local_90.size;
          }
          local_c8 = sVar24._8_8_;
          local_c0 = sVar24.data;
          aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
                   stbtt__cff_get_index(&local_90);
          sVar24.cursor = (undefined4)local_c8;
          sVar24.size = local_c8._4_4_;
          sVar24.data = local_c0;
          local_120 = (uchar *)((ulong)(local_90.size - sVar5) << 0x20);
          local_e8 = local_90.data + uVar13;
          if ((int)(local_90.size - sVar5 | sVar5) < 0 || local_90.size < (int)sVar5) {
            local_120 = (uchar *)0x0;
            local_e8 = (uchar *)0x0;
          }
        }
        local_c8 = sVar24._8_8_;
        local_c0 = sVar24.data;
        local_90.cursor = sVar8;
        if (local_90.size < (int)sVar8) {
          local_90.cursor = local_90.size;
        }
        if ((int)sVar8 < 0) {
          local_90.cursor = local_90.size;
        }
        sVar24 = stbtt__cff_get_index(&local_90);
        puVar26 = fontdict.data;
        local_f8 = 0x2000000000000000;
        uVar21 = fontdict._8_8_;
        uVar19 = local_c8;
        puVar16 = local_c0;
        goto LAB_00134148;
      }
    }
LAB_001344e8:
    local_b8 = 0;
    iVar20 = 0;
    uVar14 = 0;
    aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             ZEXT816(0);
    local_e8 = (uchar *)0x0;
    local_120 = (uchar *)0x0;
    uVar22 = 0;
    bVar23 = true;
    puVar16 = (uchar *)0x0;
    pcVar17 = (char *)0x0;
  }
  else {
    local_f0 = (uchar *)0x0;
    local_f8 = 0;
    sVar24 = (stbtt__buf)ZEXT816(0);
    puVar26 = (uchar *)0x0;
    uVar21 = 0;
    aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
             ZEXT816(0);
    local_e8 = (uchar *)0x0;
    local_120 = (uchar *)0x0;
    uVar19 = 0;
    puVar16 = (uchar *)0x0;
    if (sVar6 == 0) {
      local_b8 = 0;
      iVar20 = 0;
      uVar14 = 0;
      local_f8 = 0;
      fontdict = (stbtt__buf)ZEXT816(0);
      sVar24 = (stbtt__buf)ZEXT816(0);
      aVar25 = (anon_struct_16_3_9a98c968_for_cff_charstrings_gsubrs_subrs_fontdicts_fdselect)
               ZEXT816(0);
      local_e8 = (uchar *)0x0;
      local_120 = (uchar *)0x0;
      uVar22 = 0;
      puVar16 = (uchar *)0x0;
      pcVar17 = (char *)0x0;
      goto LAB_0013450f;
    }
LAB_00134148:
    local_a0 = sVar24._8_8_;
    local_98 = sVar24.data;
    sVar5 = stbtt__find_table((stbtt_uint8 *)ttf_data,0x17edea,local_a0);
    fontdict.cursor = (int)uVar21;
    fontdict.size = (int)((ulong)uVar21 >> 0x20);
    fontdict.data = puVar26;
    if (sVar5 == 0) {
      uVar22 = 0xffff;
    }
    else {
      uVar12 = *(ushort *)((long)ttf_data + (ulong)sVar5 + 4);
      uVar22 = (uint)(ushort)(uVar12 << 8 | uVar12 >> 8);
    }
    uVar12 = *(ushort *)((long)ttf_data + (local_a8 & 0xffffffff) + 2);
    uVar12 = uVar12 << 8 | uVar12 >> 8;
    uVar14 = 0;
    iVar20 = 0;
    sVar24.cursor = (int)uVar19;
    sVar24.size = (int)((ulong)uVar19 >> 0x20);
    sVar24.data = puVar16;
    if (uVar12 != 0) {
      uVar18 = (int)local_a8 + 4;
      uVar13 = (ulong)uVar12;
      iVar20 = 0;
      do {
        uVar15 = (ulong)uVar18;
        uVar12 = *(ushort *)((long)ttf_data + uVar15) << 8 |
                 *(ushort *)((long)ttf_data + uVar15) >> 8;
        if ((uVar12 == 0) ||
           ((uVar12 == 3 &&
            ((uVar12 = *(ushort *)((long)ttf_data + uVar15 + 2), uVar12 = uVar12 << 8 | uVar12 >> 8,
             uVar12 == 10 || (uVar12 == 1)))))) {
          uVar3 = *(uint *)((long)ttf_data + uVar15 + 4);
          iVar20 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
                   + (int)local_a8;
        }
        uVar18 = uVar18 + 8;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    local_b8 = 0xffffffff;
    bVar23 = iVar20 == 0;
    puVar16 = local_98;
    pcVar17 = local_a0;
    if (!bVar23) {
      uVar12 = *(ushort *)((long)ttf_data + (long)(int)sVar7 + 0x32);
      uVar14 = (uint)(ushort)(uVar12 << 8 | uVar12 >> 8);
    }
  }
LAB_0013450f:
  if (bVar23) {
    local_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_50 = "rf_parse_ttf_font";
    local_48 = 0x5b6e;
    rf_log_impl(8,0x17d57d,(char *)0x8);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_parse_ttf_font";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x5b6e;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 8;
  }
  else {
    lVar11 = (long)(int)sVar9;
    uVar18 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar11 + 4) << 8) |
             (uint)*(byte *)((long)ttf_data + lVar11 + 5);
    local_b0 = (rf_ttf_font_info *)CONCAT44(local_b0._4_4_,uVar22);
    uVar22 = (int)(short)((ushort)*(byte *)((long)ttf_data + lVar11 + 6) << 8) |
             (uint)*(byte *)((long)ttf_data + lVar11 + 7);
    local_7c = (float)local_60 / (float)(int)(uVar18 - uVar22);
    bVar1 = *(byte *)((long)ttf_data + lVar11 + 8);
    bVar2 = *(byte *)((long)ttf_data + lVar11 + 9);
    local_a8 = CONCAT44(local_a8._4_4_,uVar14);
    local_c8 = sVar24._8_8_;
    local_c0 = sVar24.data;
    local_a0 = pcVar17;
    local_98 = puVar16;
    memset(&prVar4->internal_stb_font_info,0,0xa0);
    *(undefined4 *)&prVar4->field_0xc1 = 0;
    *(undefined4 *)&prVar4->field_0xc4 = 0;
    prVar4->ttf_data = ttf_data;
    prVar4->font_size = (int)local_60;
    prVar4->largest_glyph_size = 0;
    prVar4->scale_factor = local_7c;
    prVar4->ascent = uVar18;
    prVar4->descent = uVar22;
    prVar4->line_gap = (int)(short)((ushort)bVar1 << 8) | (uint)bVar2;
    prVar4->valid = true;
    (prVar4->internal_stb_font_info).userdata = (void *)0x0;
    (prVar4->internal_stb_font_info).data = (uchar *)ttf_data;
    (prVar4->internal_stb_font_info).fontstart = 0;
    (prVar4->internal_stb_font_info).numGlyphs = (int)local_b0;
    (prVar4->internal_stb_font_info).loca = sVar6;
    (prVar4->internal_stb_font_info).head = sVar7;
    (prVar4->internal_stb_font_info).glyf = local_6c;
    (prVar4->internal_stb_font_info).hhea = sVar9;
    (prVar4->internal_stb_font_info).hmtx = local_70;
    (prVar4->internal_stb_font_info).kern = local_74;
    (prVar4->internal_stb_font_info).gpos = local_78;
    (prVar4->internal_stb_font_info).svg = (int)local_b8;
    (prVar4->internal_stb_font_info).index_map = iVar20;
    (prVar4->internal_stb_font_info).indexToLocFormat = (int)local_a8;
    (prVar4->internal_stb_font_info).cff.data = local_f0;
    (prVar4->internal_stb_font_info).cff.cursor = (undefined4)local_f8;
    (prVar4->internal_stb_font_info).cff.size = local_f8._4_4_;
    (prVar4->internal_stb_font_info).charstrings.data = local_98;
    *(char **)&(prVar4->internal_stb_font_info).charstrings.cursor = local_a0;
    (prVar4->internal_stb_font_info).gsubrs.data = fontdict.data;
    (prVar4->internal_stb_font_info).gsubrs.cursor = (int)fontdict._8_8_;
    (prVar4->internal_stb_font_info).gsubrs.size = (int)((ulong)fontdict._8_8_ >> 0x20);
    (prVar4->internal_stb_font_info).subrs.data = local_c0;
    (prVar4->internal_stb_font_info).subrs.cursor = (undefined4)local_c8;
    (prVar4->internal_stb_font_info).subrs.size = local_c8._4_4_;
    (prVar4->internal_stb_font_info).fontdicts = aVar25;
    (prVar4->internal_stb_font_info).fdselect.data = local_e8;
    *(uchar **)&(prVar4->internal_stb_font_info).fdselect.cursor = local_120;
  }
  return prVar4;
}

Assistant:

RF_API rf_ttf_font_info rf_parse_ttf_font(const void* ttf_data, rf_int font_size)
{
    rf_ttf_font_info result = {0};

    if (ttf_data && font_size > 0)
    {
        stbtt_fontinfo font_info = {0};
        if (stbtt_InitFont(&font_info, ttf_data, 0))
        {
            // Calculate font scale factor
            float scale_factor = stbtt_ScaleForPixelHeight(&font_info, (float)font_size);

            // Calculate font basic metrics
            // NOTE: ascent is equivalent to font baseline
            int ascent, descent, line_gap;
            stbtt_GetFontVMetrics(&font_info, &ascent, &descent, &line_gap);

            result = (rf_ttf_font_info)
            {
                .ttf_data = ttf_data,
                .font_size = font_size,
                .scale_factor = scale_factor,
                .ascent = ascent,
                .descent = descent,
                .line_gap = line_gap,
                .valid = true,
            };

            RF_ASSERT(sizeof(stbtt_fontinfo) == sizeof(result.internal_stb_font_info));
            memcpy(&result.internal_stb_font_info, &font_info, sizeof(stbtt_fontinfo));
        }
        else RF_LOG_ERROR(RF_STBTT_FAILED, "STB failed to parse ttf font.");
    }

    return result;
}